

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

bool __thiscall wasm::WATParser::Lexer::takeLParen(Lexer *this)

{
  size_t sVar1;
  string_view sv;
  LexCtx local_30;
  
  local_30.input = next(this);
  local_30.lexedSize = 0;
  sv._M_str = "(";
  sv._M_len = 1;
  sVar1 = anon_unknown_0::LexCtx::startsWith(&local_30,sv);
  if (sVar1 != 0) {
    this->pos = this->pos + 1;
    advance(this);
  }
  return (bool)(char)sVar1;
}

Assistant:

bool Lexer::takeLParen() {
  if (LexCtx(next()).startsWith("("sv)) {
    ++pos;
    advance();
    return true;
  }
  return false;
}